

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O0

DdNode * addTriangleRecur(DdManager *dd,DdNode *f,DdNode *g,int *vars,DdNode *cube)

{
  DdNode *f_00;
  DdNode *g_00;
  DdNode *local_a8;
  DdHalfWord local_9c;
  DdHalfWord local_98;
  DdHalfWord local_94;
  DdNode *tmp;
  int index;
  int topg;
  int topf;
  int top;
  double value;
  DdNode *res;
  DdNode *e;
  DdNode *t;
  DdNode *gvn;
  DdNode *gv;
  DdNode *fvn;
  DdNode *fv;
  DdNode *cube_local;
  int *vars_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if ((f == dd->plusinfinity) || (g == dd->plusinfinity)) {
    dd_local = (DdManager *)dd->plusinfinity;
  }
  else if ((f->index == 0x7fffffff) && (g->index == 0x7fffffff)) {
    dd_local = (DdManager *)cuddUniqueConst(dd,(f->type).value + (g->type).value);
  }
  else {
    vars_local = (int *)g;
    g_local = f;
    if (f < g) {
      vars_local = (int *)f;
      g_local = g;
    }
    if (((g_local->ref == 1) && (vars_local[1] == 1)) ||
       (dd_local = (DdManager *)cuddCacheLookup(dd,0x86,g_local,(DdNode *)vars_local,cube),
       dd_local == (DdManager *)0x0)) {
      if (g_local->index == 0x7fffffff) {
        local_94 = g_local->index;
      }
      else {
        local_94 = dd->perm[g_local->index];
      }
      if (*vars_local == 0x7fffffff) {
        local_98 = *vars_local;
      }
      else {
        local_98 = dd->perm[(uint)*vars_local];
      }
      if ((int)local_98 < (int)local_94) {
        local_9c = local_98;
      }
      else {
        local_9c = local_94;
      }
      if (local_9c == local_94) {
        fvn = (g_local->type).kids.T;
        gv = (g_local->type).kids.E;
      }
      else {
        gv = g_local;
        fvn = g_local;
      }
      if (local_9c == local_98) {
        gvn = *(DdNode **)(vars_local + 4);
        t = *(DdNode **)(vars_local + 6);
      }
      else {
        t = (DdNode *)vars_local;
        gvn = (DdNode *)vars_local;
      }
      f_00 = addTriangleRecur(dd,fvn,gvn,vars,cube);
      if (f_00 == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4) + 1;
        g_00 = addTriangleRecur(dd,gv,t,vars,cube);
        if (g_00 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,f_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4) + 1;
          if (vars[dd->invperm[(int)local_9c]] < 0) {
            local_a8 = f_00;
            if (f_00 != g_00) {
              local_a8 = cuddUniqueInter(dd,dd->invperm[(int)local_9c],f_00,g_00);
            }
            value = (double)local_a8;
            if (local_a8 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,f_00);
              Cudd_RecursiveDeref(dd,g_00);
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4) + -1;
            *(int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4) + -1;
          }
          else {
            value = (double)cuddAddApplyRecur(dd,Cudd_addMinimum,f_00,g_00);
            if ((DdNode *)value == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,f_00);
              Cudd_RecursiveDeref(dd,g_00);
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref(dd,f_00);
            Cudd_RecursiveDeref(dd,g_00);
            *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) + -1;
          }
          if ((g_local->ref != 1) || (vars_local[1] != 1)) {
            cuddCacheInsert(dd,0x86,g_local,(DdNode *)vars_local,cube,(DdNode *)value);
          }
          dd_local = (DdManager *)value;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
addTriangleRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  int * vars,
  DdNode *cube)
{
    DdNode *fv, *fvn, *gv, *gvn, *t, *e, *res;
    CUDD_VALUE_TYPE value;
    int top, topf, topg, index;

    statLine(dd);
    if (f == DD_PLUS_INFINITY(dd) || g == DD_PLUS_INFINITY(dd)) {
        return(DD_PLUS_INFINITY(dd));
    }

    if (cuddIsConstant(f) && cuddIsConstant(g)) {
        value = cuddV(f) + cuddV(g);
        res = cuddUniqueConst(dd, value);
        return(res);
    }
    if (f < g) {
        DdNode *tmp = f;
        f = g;
        g = tmp;
    }

    if (f->ref != 1 || g->ref != 1) {
        res = cuddCacheLookup(dd, DD_ADD_TRIANGLE_TAG, f, g, cube);
        if (res != NULL) {
            return(res);
        }
    }

    topf = cuddI(dd,f->index); topg = cuddI(dd,g->index);
    top = ddMin(topf,topg);

    if (top == topf) {fv = cuddT(f); fvn = cuddE(f);} else {fv = fvn = f;}
    if (top == topg) {gv = cuddT(g); gvn = cuddE(g);} else {gv = gvn = g;}

    t = addTriangleRecur(dd, fv, gv, vars, cube);
    if (t == NULL) return(NULL);
    cuddRef(t);
    e = addTriangleRecur(dd, fvn, gvn, vars, cube);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd, t);
        return(NULL);
    }
    cuddRef(e);

    index = dd->invperm[top];
    if (vars[index] < 0) {
        res = (t == e) ? t : cuddUniqueInter(dd,index,t,e);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, t);
            Cudd_RecursiveDeref(dd, e);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    } else {
        res = cuddAddApplyRecur(dd,Cudd_addMinimum,t,e);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, t);
            Cudd_RecursiveDeref(dd, e);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDeref(dd, t);
        Cudd_RecursiveDeref(dd, e);
        cuddDeref(res);
    }

    if (f->ref != 1 || g->ref != 1) {
        cuddCacheInsert(dd, DD_ADD_TRIANGLE_TAG, f, g, cube, res);
    }

    return(res);

}